

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ScopedNameSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ScopedNameSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *pSVar1;
  size_t index_local;
  ScopedNameSyntax *this_local;
  
  if (index == 0) {
    pSVar1 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->left);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else if (index == 1) {
    token.kind = (this->separator).kind;
    token._2_1_ = (this->separator).field_0x2;
    token.numFlags.raw = (this->separator).numFlags.raw;
    token.rawLen = (this->separator).rawLen;
    token.info = (this->separator).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    pSVar1 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->right);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ScopedNameSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return left.get();
        case 1: return separator;
        case 2: return right.get();
        default: return nullptr;
    }
}